

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

void av1_init_macroblockd(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  int iVar1;
  long lVar2;
  long in_RSI;
  AV1_COMMON *in_RDI;
  int i;
  CommonQuantParams *quant_params;
  int num_planes;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  CFL_CTX *cfl;
  
  iVar1 = av1_num_planes(in_RDI);
  cfl = (CFL_CTX *)&in_RDI->quant_params;
  for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
    if (*(char *)(in_RSI + 0x10 + (long)iVar3 * 0xa30) == '\0') {
      lVar2 = in_RSI + 0x10 + (long)iVar3 * 0xa30;
      *(undefined8 *)(lVar2 + 0x80) = *(undefined8 *)(cfl->recon_buf_q3 + 0xe);
      *(undefined8 *)(lVar2 + 0x88) = *(undefined8 *)(cfl->recon_buf_q3 + 0x12);
      *(undefined8 *)(lVar2 + 0x90) = *(undefined8 *)(cfl->recon_buf_q3 + 0x16);
      *(undefined8 *)(lVar2 + 0x98) = *(undefined8 *)(cfl->recon_buf_q3 + 0x1a);
      memcpy((void *)(in_RSI + (long)iVar3 * 0xa30 + 0xc0),cfl[3].recon_buf_q3 + 0x3d6,0x4c0);
    }
    else if (iVar3 == 1) {
      *(undefined8 *)(in_RSI + 0xac0) = *(undefined8 *)(cfl->recon_buf_q3 + 0x1e);
      *(undefined8 *)(in_RSI + 0xac8) = *(undefined8 *)(cfl->recon_buf_q3 + 0x22);
      *(undefined8 *)(in_RSI + 0xad0) = *(undefined8 *)(cfl->recon_buf_q3 + 0x26);
      *(undefined8 *)(in_RSI + 0xad8) = *(undefined8 *)(cfl->recon_buf_q3 + 0x2a);
      memcpy((void *)(in_RSI + 0xaf0),cfl[3].ac_buf_q3 + 0x236,0x4c0);
    }
    else {
      lVar2 = in_RSI + 0x10 + (long)iVar3 * 0xa30;
      *(undefined8 *)(lVar2 + 0x80) = *(undefined8 *)(cfl->recon_buf_q3 + 0x2e);
      *(undefined8 *)(lVar2 + 0x88) = *(undefined8 *)(cfl->recon_buf_q3 + 0x32);
      *(undefined8 *)(lVar2 + 0x90) = *(undefined8 *)(cfl->recon_buf_q3 + 0x36);
      *(undefined8 *)(lVar2 + 0x98) = *(undefined8 *)(cfl->recon_buf_q3 + 0x3a);
      memcpy((void *)(in_RSI + (long)iVar3 * 0xa30 + 0xc0),cfl[4].recon_buf_q3 + 0x48,0x4c0);
    }
  }
  *(int *)(in_RSI + 8) = (in_RDI->mi_params).mi_stride;
  *(aom_internal_error_info **)(in_RSI + 0x29f0) = in_RDI->error;
  cfl_init(cfl,(SequenceHeader *)CONCAT44(iVar3,in_stack_ffffffffffffffd8));
  return;
}

Assistant:

static inline void av1_init_macroblockd(AV1_COMMON *cm, MACROBLOCKD *xd) {
  const int num_planes = av1_num_planes(cm);
  const CommonQuantParams *const quant_params = &cm->quant_params;

  for (int i = 0; i < num_planes; ++i) {
    if (xd->plane[i].plane_type == PLANE_TYPE_Y) {
      memcpy(xd->plane[i].seg_dequant_QTX, quant_params->y_dequant_QTX,
             sizeof(quant_params->y_dequant_QTX));
      memcpy(xd->plane[i].seg_iqmatrix, quant_params->y_iqmatrix,
             sizeof(quant_params->y_iqmatrix));

    } else {
      if (i == AOM_PLANE_U) {
        memcpy(xd->plane[i].seg_dequant_QTX, quant_params->u_dequant_QTX,
               sizeof(quant_params->u_dequant_QTX));
        memcpy(xd->plane[i].seg_iqmatrix, quant_params->u_iqmatrix,
               sizeof(quant_params->u_iqmatrix));
      } else {
        memcpy(xd->plane[i].seg_dequant_QTX, quant_params->v_dequant_QTX,
               sizeof(quant_params->v_dequant_QTX));
        memcpy(xd->plane[i].seg_iqmatrix, quant_params->v_iqmatrix,
               sizeof(quant_params->v_iqmatrix));
      }
    }
  }
  xd->mi_stride = cm->mi_params.mi_stride;
  xd->error_info = cm->error;
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
  cfl_init(&xd->cfl, cm->seq_params);
#endif
}